

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O2

int av1_index_color_cache
              (uint16_t *color_cache,int n_cache,uint16_t *colors,int n_colors,
              uint8_t *cache_color_found,int *out_cache_colors)

{
  uint16_t *puVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int in_cache_flags [8];
  undefined8 local_60;
  int local_58 [10];
  
  if (n_cache < 1) {
    uVar2 = 0;
    uVar6 = 0;
    if (0 < n_colors) {
      uVar6 = (ulong)(uint)n_colors;
    }
    for (; uVar6 != uVar2; uVar2 = uVar2 + 1) {
      out_cache_colors[uVar2] = (uint)colors[uVar2];
    }
  }
  else {
    uVar6 = 0;
    local_60 = cache_color_found;
    memset(cache_color_found,0,(ulong)(uint)n_cache);
    local_58[4] = 0;
    local_58[5] = 0;
    local_58[6] = 0;
    local_58[7] = 0;
    local_58[0] = 0;
    local_58[1] = 0;
    local_58[2] = 0;
    local_58[3] = 0;
    uVar2 = 0;
    if (0 < n_colors) {
      uVar2 = (ulong)(uint)n_colors;
    }
    iVar3 = 0;
    while ((uVar6 < (uint)n_cache && (iVar3 < n_colors))) {
      uVar4 = 0;
      do {
        if (uVar2 == uVar4) goto LAB_001c1bf3;
        puVar1 = colors + uVar4;
        uVar4 = uVar4 + 1;
      } while (*puVar1 != color_cache[uVar6]);
      *(undefined4 *)((long)&local_60 + uVar4 * 4 + 4) = 1;
      local_60[uVar6] = '\x01';
      iVar3 = iVar3 + 1;
LAB_001c1bf3:
      uVar6 = uVar6 + 1;
    }
    n_colors = 0;
    for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
      if (local_58[uVar6] == 0) {
        lVar5 = (long)n_colors;
        n_colors = n_colors + 1;
        out_cache_colors[lVar5] = (uint)colors[uVar6];
      }
    }
  }
  return n_colors;
}

Assistant:

int av1_index_color_cache(const uint16_t *color_cache, int n_cache,
                          const uint16_t *colors, int n_colors,
                          uint8_t *cache_color_found, int *out_cache_colors) {
  if (n_cache <= 0) {
    for (int i = 0; i < n_colors; ++i) out_cache_colors[i] = colors[i];
    return n_colors;
  }
  memset(cache_color_found, 0, n_cache * sizeof(*cache_color_found));
  int n_in_cache = 0;
  int in_cache_flags[PALETTE_MAX_SIZE];
  memset(in_cache_flags, 0, sizeof(in_cache_flags));
  for (int i = 0; i < n_cache && n_in_cache < n_colors; ++i) {
    for (int j = 0; j < n_colors; ++j) {
      if (colors[j] == color_cache[i]) {
        in_cache_flags[j] = 1;
        cache_color_found[i] = 1;
        ++n_in_cache;
        break;
      }
    }
  }
  int j = 0;
  for (int i = 0; i < n_colors; ++i)
    if (!in_cache_flags[i]) out_cache_colors[j++] = colors[i];
  assert(j == n_colors - n_in_cache);
  return j;
}